

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::Cluster::AddMetadata
          (Cluster *this,uint8_t *data,uint64_t length,uint64_t track_number,uint64_t abs_timecode,
          uint64_t duration_timecode)

{
  bool bVar1;
  Frame frame;
  Frame local_98;
  
  Frame::Frame(&local_98);
  bVar1 = Frame::Init(&local_98,data,length);
  if (bVar1) {
    local_98.duration_set_ = true;
    local_98.is_key_ = true;
    local_98.duration_ = duration_timecode;
    local_98.track_number_ = track_number;
    local_98.timestamp_ = abs_timecode;
    bVar1 = QueueOrWriteFrame(this,&local_98);
  }
  else {
    bVar1 = false;
  }
  Frame::~Frame(&local_98);
  return bVar1;
}

Assistant:

bool Cluster::AddMetadata(const uint8_t* data, uint64_t length,
                          uint64_t track_number, uint64_t abs_timecode,
                          uint64_t duration_timecode) {
  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_duration(duration_timecode);
  frame.set_is_key(true);  // All metadata blocks are keyframes.
  return QueueOrWriteFrame(&frame);
}